

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestSubdirCommand::InitialPass
          (cmCTestSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  pointer in_name;
  string fname;
  cmWorkingDirectory workdir;
  string cwd;
  string local_108;
  cmCTestSubdirCommand *local_e8;
  cmWorkingDirectory local_e0;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_e8 = this;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_e0.OldDir.field_2;
    local_e0.OldDir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"called with incorrect number of arguments","");
    cmCommand::SetError(&local_e8->super_cmCommand,&local_e0.OldDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.OldDir._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0.OldDir._M_dataplus._M_p,
                      local_e0.OldDir.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_50,(SystemTools *)0x1,SUB81(param_2,0));
    in_name = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_78 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    if (in_name != local_78) {
      do {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)&local_108);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_108);
          std::__cxx11::string::append((char *)&local_108);
          std::__cxx11::string::_M_append((char *)&local_108,(ulong)(in_name->_M_dataplus)._M_p);
        }
        bVar2 = cmsys::SystemTools::FileIsDirectory(&local_108);
        iVar6 = 3;
        if (bVar2) {
          cmWorkingDirectory::cmWorkingDirectory(&local_e0,&local_108);
          if (local_e0.ResultCode == 0) {
            bVar2 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
            if (!bVar2) {
              bVar2 = cmsys::SystemTools::FileExists("DartTestfile.txt");
              iVar6 = 3;
              if (!bVar2) goto LAB_001a74bb;
            }
            std::__cxx11::string::append((char *)&local_108);
            std::__cxx11::string::append((char *)&local_108);
            bVar2 = cmMakefile::ReadDependentFile
                              ((local_e8->super_cmCommand).Makefile,&local_108,true);
            cmWorkingDirectory::~cmWorkingDirectory(&local_e0);
            iVar6 = 0;
            if (!bVar2) {
              paVar1 = &local_e0.OldDir.field_2;
              local_e0.OldDir._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"Could not find include file: ","");
              std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_108._M_dataplus._M_p);
              cmCommand::SetError(&local_e8->super_cmCommand,&local_e0.OldDir);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0.OldDir._M_dataplus._M_p != paVar1) {
                operator_delete(local_e0.OldDir._M_dataplus._M_p,
                                local_e0.OldDir.field_2._M_allocated_capacity + 1);
              }
              iVar6 = 1;
            }
          }
          else {
            std::operator+(&local_70,"Failed to change directory to ",&local_108);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
            plVar4 = plVar3 + 2;
            if ((long *)*plVar3 == plVar4) {
              local_88 = *plVar4;
              lStack_80 = plVar3[3];
              local_98 = &local_88;
            }
            else {
              local_88 = *plVar4;
              local_98 = (long *)*plVar3;
            }
            local_90 = plVar3[1];
            *plVar3 = (long)plVar4;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            strerror(local_e0.ResultCode);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            psVar5 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_b8.field_2._M_allocated_capacity = *psVar5;
              local_b8.field_2._8_8_ = plVar3[3];
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar5;
              local_b8._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_b8._M_string_length = plVar3[1];
            *plVar3 = (long)psVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            cmCommand::SetError(&local_e8->super_cmCommand,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            iVar6 = 1;
LAB_001a74bb:
            cmWorkingDirectory::~cmWorkingDirectory(&local_e0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if ((iVar6 != 3) && (iVar6 != 0)) {
          bVar2 = false;
          goto LAB_001a754c;
        }
        in_name = in_name + 1;
      } while (in_name != local_78);
      bVar2 = true;
    }
LAB_001a754c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  for (std::string const& arg : args) {
    std::string fname;

    if (cmSystemTools::FileIsFullPath(arg)) {
      fname = arg;
    } else {
      fname = cwd;
      fname += "/";
      fname += arg;
    }

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // No subdirectory? So what...
      continue;
    }
    bool readit = false;
    {
      cmWorkingDirectory workdir(fname);
      if (workdir.Failed()) {
        this->SetError("Failed to change directory to " + fname + " : " +
                       std::strerror(workdir.GetLastResult()));
        return false;
      }
      const char* testFilename;
      if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
        // does the CTestTestfile.cmake exist ?
        testFilename = "CTestTestfile.cmake";
      } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
        // does the DartTestfile.txt exist ?
        testFilename = "DartTestfile.txt";
      } else {
        // No CTestTestfile? Who cares...
        continue;
      }
      fname += "/";
      fname += testFilename;
      readit = this->Makefile->ReadDependentFile(fname);
    }
    if (!readit) {
      std::string m = "Could not find include file: ";
      m += fname;
      this->SetError(m);
      return false;
    }
  }
  return true;
}